

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeCreator.cpp
# Opt level: O2

void __thiscall
OpenMD::MoleculeCreator::createOverrideAtomTypes
          (MoleculeCreator *this,ForceField *ff,MoleculeStamp *molStamp)

{
  double dVar1;
  long lVar2;
  AtomType *this_00;
  AtomType *pAVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  string baseType;
  FixedChargeAdapter fca;
  string atomTypeOverrideName;
  ostringstream ss;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8 [11];
  
  lVar5 = (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(molStamp->atomStamps_).
                super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  lVar4 = 0;
  while( true ) {
    bVar6 = lVar5 == 0;
    lVar5 = lVar5 + -1;
    if (bVar6) break;
    lVar2 = *(long *)((long)(molStamp->atomStamps_).
                            super__Vector_base<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>
                            ._M_impl.super__Vector_impl_data._M_start + (lVar4 >> 0x1d));
    std::__cxx11::string::string((string *)local_1a8,(string *)(lVar2 + 0x98));
    this_00 = ForceField::getAtomType(ff,local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    if (this_00 == (AtomType *)0x0) {
      std::__cxx11::string::string((string *)local_1a8,(string *)(lVar2 + 0x98));
      snprintf(painCave.errMsg,2000,"Can not find Matching Atom Type for[%s]",
               local_1a8[0]._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)local_1a8);
      painCave.isFatal = 1;
      simError();
    }
    if (*(char *)(lVar2 + 0xf2) == '\x01') {
      AtomType::getName_abi_cxx11_(&local_228,this_00);
      dVar1 = *(double *)(lVar2 + 0xe8);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::ostream::_M_insert<double>(dVar1);
      std::operator+(&local_208,&local_228,"_q=");
      std::__cxx11::stringbuf::str();
      std::operator+(&local_1c8,&local_208,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      pAVar3 = ForceField::getAtomType(ff,&local_1c8);
      if (pAVar3 == (AtomType *)0x0) {
        pAVar3 = (AtomType *)operator_new(0xf8);
        AtomType::AtomType(pAVar3);
        (*pAVar3->_vptr_AtomType[2])(pAVar3,this_00);
        AtomType::setIdent(pAVar3,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count);
        AtomType::setName(pAVar3,&local_1c8);
        ForceField::addAtomType(ff,&local_1c8,pAVar3);
        local_208._M_dataplus._M_p = (pointer)pAVar3;
        FixedChargeAdapter::makeFixedCharge
                  ((FixedChargeAdapter *)&local_208,
                   dVar1 * (ff->forceFieldOptions_).ChargeUnitScaling.data_);
      }
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::__cxx11::string::~string((string *)&local_228);
    }
    lVar4 = lVar4 + 0x100000000;
  }
  return;
}

Assistant:

void MoleculeCreator::createOverrideAtomTypes(ForceField* ff,
						MoleculeStamp* molStamp) {

    // Some stamps have overrides of default types in the force field.
    // This runs through atomStamps which can have overrides and makes sure
    // that the types are created, even if this processor doesn't end up
    // owning that molecule:

    AtomStamp* stamp;
    size_t nAtom = molStamp->getNAtoms();
    
    for (size_t i = 0; i < nAtom; ++i) {
      stamp = molStamp->getAtomStamp(i);
      AtomType* atomType = ff->getAtomType(stamp->getType());
    
      if (atomType == NULL) {
	snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
		 "Can not find Matching Atom Type for[%s]",
		 stamp->getType().c_str());
	
	painCave.isFatal = 1;
	simError();
      }

      if (stamp->hasOverride()) {
	std::string baseType = atomType->getName();
	RealType oc          = stamp->getOverrideCharge();
	
	// Create a new atom type name that builds in the override charge:
	std::ostringstream ss;
	ss << oc;
	std::string atomTypeOverrideName = baseType + "_q=" + ss.str();
	
	// Maybe we've seen this before?
	
	AtomType* atB = ff->getAtomType(atomTypeOverrideName);
	
	if (atB == NULL) {
	  // Nope, we've never seen it before, so make a new one:
	  AtomType* atomTypeOverride = new AtomType();
	  // Base points to the atomType we already found
	  atomTypeOverride->useBase(atomType);
	  int ident = ff->getNAtomType();
	  atomTypeOverride->setIdent(ident);
	  atomTypeOverride->setName(atomTypeOverrideName);
	  ff->addAtomType(atomTypeOverrideName, atomTypeOverride);
	  FixedChargeAdapter fca = FixedChargeAdapter(atomTypeOverride);
	  RealType charge =
            ff->getForceFieldOptions().getChargeUnitScaling() * oc;
	  fca.makeFixedCharge(charge);
	} 
      }
    }    
  }